

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void __thiscall GLPortal::DrawPortalStencil(GLPortal *this)

{
  TArray<unsigned_int,_unsigned_int> *this_00;
  uint *puVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  GLWall *pGVar4;
  uint uVar5;
  long lVar6;
  
  this_00 = &this->mPrimIndices;
  if ((this->mPrimIndices).Count == 0) {
    TArray<unsigned_int,_unsigned_int>::Resize(this_00,(this->lines).Count * 2);
    uVar5 = 1;
    lVar6 = 0;
    for (uVar3 = 0; uVar3 < (this->lines).Count; uVar3 = uVar3 + 1) {
      pGVar4 = (this->lines).Array;
      if (gl.buffermethod != 1) {
        GLWall::MakeVertices((GLWall *)((long)pGVar4->vertexes + lVar6 + -0x18),false);
        pGVar4 = (this->lines).Array;
      }
      puVar1 = this_00->Array;
      puVar1[uVar5 - 1] = *(uint *)((long)pGVar4->zfloor + lVar6 + 8);
      puVar1[uVar5] = *(uint *)((long)pGVar4->zfloor + lVar6 + 0xc);
      uVar5 = uVar5 + 2;
      lVar6 = lVar6 + 0x140;
    }
  }
  FRenderState::Apply(&gl_RenderState);
  for (uVar5 = 1; uVar5 - 1 < (this->mPrimIndices).Count; uVar5 = uVar5 + 2) {
    (*_ptrc_glDrawArrays)(6,this_00->Array[uVar5 - 1],this_00->Array[uVar5]);
  }
  iVar2 = (*this->_vptr_GLPortal[5])(this);
  if (((char)iVar2 != '\0') && (1 < (this->lines).Count)) {
    (*_ptrc_glDrawArrays)(6,0xc,4);
    (*_ptrc_glDrawArrays)(6,0x10,4);
    return;
  }
  return;
}

Assistant:

void GLPortal::DrawPortalStencil()
{
	if (mPrimIndices.Size() == 0)
	{
		mPrimIndices.Resize(2 * lines.Size());

		for (unsigned int i = 0; i < lines.Size(); i++)
		{
			if (gl.buffermethod != BM_DEFERRED) lines[i].MakeVertices(false);
			mPrimIndices[i * 2] = lines[i].vertindex;
			mPrimIndices[i * 2 + 1] = lines[i].vertcount;
		}
	}
	gl_RenderState.Apply();
	for (unsigned int i = 0; i < mPrimIndices.Size(); i += 2)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, mPrimIndices[i], mPrimIndices[i + 1]);
	}
	if (NeedCap() && lines.Size() > 1)
	{
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILTOP_INDEX, 4);
		GLRenderer->mVBO->RenderArray(GL_TRIANGLE_FAN, FFlatVertexBuffer::STENCILBOTTOM_INDEX, 4);
	}
}